

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_4> __thiscall tcu::absDiff<float,4>(tcu *this,Vector<float,_4> *a,Vector<float,_4> *b)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int ndx;
  long lVar4;
  ulong extraout_XMM0_Qa;
  ulong uVar5;
  undefined1 in_XMM1 [16];
  Vector<float,_4> VVar6;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar5 = extraout_XMM0_Qa;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    fVar1 = a->m_data[lVar4];
    uVar5 = (ulong)(uint)fVar1;
    fVar2 = b->m_data[lVar4];
    uVar3 = ~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
            (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1);
    in_XMM1 = ZEXT416(uVar3);
    *(uint *)(this + lVar4 * 4) = uVar3;
  }
  VVar6.m_data._8_8_ = in_XMM1._0_8_;
  VVar6.m_data[0] = (float)(int)uVar5;
  VVar6.m_data[1] = (float)(int)(uVar5 >> 0x20);
  return (Vector<float,_4>)VVar6.m_data;
}

Assistant:

static inline Vector<T, Size> absDiff (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	Vector<T, Size> res;

	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = (a[ndx] > b[ndx]) ? (a[ndx] - b[ndx]) : (b[ndx] - a[ndx]);

	return res;
}